

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O2

void __thiscall
TPZStream::Write<long,long>
          (TPZStream *this,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *vec)

{
  size_t size;
  _Self __tmp;
  _Rb_tree_node_base *p_Var1;
  long lVar2;
  TPZManVector<long,_10> valVec;
  TPZManVector<long,_10> keyVec;
  TPZManVector<long,_10> TStack_108;
  TPZManVector<long,_10> local_98;
  
  size = (vec->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  TPZManVector<long,_10>::TPZManVector(&local_98,size);
  TPZManVector<long,_10>::TPZManVector(&TStack_108,size);
  p_Var1 = (vec->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  lVar2 = 0;
  while ((_Rb_tree_header *)p_Var1 != &(vec->_M_t)._M_impl.super__Rb_tree_header) {
    *(undefined8 *)((long)local_98.super_TPZVec<long>.fStore + lVar2) = *(undefined8 *)(p_Var1 + 1);
    *(_Base_ptr *)((long)TStack_108.super_TPZVec<long>.fStore + lVar2) = p_Var1[1]._M_parent;
    p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    lVar2 = lVar2 + 8;
  }
  Write<long>(this,&local_98.super_TPZVec<long>);
  Write<long>(this,&TStack_108.super_TPZVec<long>);
  TPZManVector<long,_10>::~TPZManVector(&TStack_108);
  TPZManVector<long,_10>::~TPZManVector(&local_98);
  return;
}

Assistant:

void Write(const std::map<T, U> &vec) {
        int64_t sz = vec.size();
        TPZManVector<T> keyVec(sz);
        TPZManVector<U> valVec(sz);
        int64_t count = 0;
        typename std::map<T, U>::const_iterator it;
        for (it = vec.begin(); it != vec.end(); it++) {
            keyVec[count] = it->first;
            valVec[count++] = it->second;
        }
        Write(keyVec);
        Write(valVec);
    }